

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O0

FILE * __thiscall MemPlumberInternal::openFile(MemPlumberInternal *this,char *fileName,bool append)

{
  int iVar1;
  MemPlumberInternal *local_30;
  FILE *file;
  bool append_local;
  char *fileName_local;
  MemPlumberInternal *this_local;
  
  iVar1 = strncmp(fileName,"",1000);
  if (iVar1 == 0) {
    this_local = _stdout;
  }
  else {
    if (append) {
      local_30 = (MemPlumberInternal *)fopen(fileName,"at");
      if (local_30 == (MemPlumberInternal *)0x0) {
        local_30 = (MemPlumberInternal *)fopen(fileName,"wt");
      }
    }
    else {
      local_30 = (MemPlumberInternal *)fopen(fileName,"wt");
    }
    if (local_30 == (MemPlumberInternal *)0x0) {
      fprintf(_stderr,"WARNING: couldn\'t open file `%s`\n",fileName);
    }
    this_local = local_30;
  }
  return (FILE *)this_local;
}

Assistant:

FILE* openFile(const char* fileName, bool append) {
        if (strncmp(fileName, "", 1000) == 0) { // dump to stdout
            return stdout;
        }
        else { // dump to file
            FILE* file = NULL;
            if (!append) { // override the file
                file = fopen(fileName, "wt");
            }
            else { // append the file
                file = fopen(fileName, "at"); // try append
                if (!file) { // if append failed, create a new file
                    file = fopen(fileName, "wt");
                }
            }

            if (!file) {
                fprintf(stderr, "WARNING: couldn't open file `%s`\n", fileName);
            }

            return file;
        }
    }